

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool __thiscall
frozen::basic_string<char16_t>::operator==
          (basic_string<char16_t> *this,basic_string<char16_t> other)

{
  chr_t_conflict1 *pcVar1;
  chr_t_conflict1 *pcVar2;
  size_t sVar3;
  bool bVar4;
  
  if (this->size_ != other.size_) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar4 = other.size_ == sVar3;
    if (bVar4) {
      return bVar4;
    }
    pcVar1 = this->data_ + sVar3;
    pcVar2 = other.data_ + sVar3;
    sVar3 = sVar3 + 1;
  } while (*pcVar1 == *pcVar2);
  return bVar4;
}

Assistant:

constexpr bool operator==(basic_string other) const {
    if (size_ != other.size_)
      return false;
    for (std::size_t i = 0; i < size_; ++i)
      if (data_[i] != other.data_[i])
        return false;
    return true;
  }